

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdGetTxInfo(void *handle,int net_type,char *tx_hex_string,char **txid,char **wtxid,
                uint32_t *size,uint32_t *vsize,uint32_t *weight,uint32_t *version,uint32_t *locktime
                )

{
  bool bVar1;
  CfdException *this;
  allocator local_14a;
  bool is_bitcoin;
  char *work_wtxid;
  char *work_txid;
  void *local_138;
  string local_130;
  char **local_110;
  TransactionContext tx;
  
  work_txid = (char *)0x0;
  work_wtxid = (char *)0x0;
  local_138 = handle;
  local_110 = wtxid;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type,&is_bitcoin);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_130,tx_hex_string,&local_14a);
      cfd::TransactionContext::TransactionContext(&tx,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      cfd::capi::GetTxInfo
                ((AbstractTransaction *)&tx,&work_txid,&work_wtxid,size,vsize,weight,version,
                 locktime);
      cfd::TransactionContext::~TransactionContext(&tx);
    }
    else {
      std::__cxx11::string::string((string *)&local_130,tx_hex_string,&local_14a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      cfd::capi::GetTxInfo
                ((AbstractTransaction *)&tx,&work_txid,&work_wtxid,size,vsize,weight,version,
                 locktime);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)&tx);
    }
    if (work_txid != (char *)0x0) {
      *txid = work_txid;
    }
    if (work_wtxid != (char *)0x0) {
      *local_110 = work_wtxid;
    }
    return 0;
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x5277c7;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x99f;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_83e341;
  cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_130);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInfo(
    void* handle, int net_type, const char* tx_hex_string, char** txid,
    char** wtxid, uint32_t* size, uint32_t* vsize, uint32_t* weight,
    uint32_t* version, uint32_t* locktime) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_txid = nullptr;
  char* work_wtxid = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      GetTxInfo(
          &tx, &work_txid, &work_wtxid, size, vsize, weight, version,
          locktime);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_wtxid != nullptr) *wtxid = work_wtxid;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_wtxid);
  return result;
}